

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestPackage.cpp
# Opt level: O0

PackageInfo * __thiscall
tcu::TestPackageRegistry::getPackageInfoByName(TestPackageRegistry *this,char *packageName)

{
  bool bVar1;
  size_type sVar2;
  const_reference ppPVar3;
  int local_24;
  int i;
  char *packageName_local;
  TestPackageRegistry *this_local;
  
  local_24 = 0;
  while( true ) {
    sVar2 = std::
            vector<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
            ::size(&this->m_packageInfos);
    if ((int)sVar2 <= local_24) {
      return (PackageInfo *)0x0;
    }
    ppPVar3 = std::
              vector<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
              ::operator[](&this->m_packageInfos,(long)local_24);
    bVar1 = std::operator==(&(*ppPVar3)->name,packageName);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  ppPVar3 = std::
            vector<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
            ::operator[](&this->m_packageInfos,(long)local_24);
  return *ppPVar3;
}

Assistant:

TestPackageRegistry::PackageInfo* TestPackageRegistry::getPackageInfoByName (const char* packageName) const
{
	for (int i = 0; i < (int)m_packageInfos.size(); i++)
	{
		if (m_packageInfos[i]->name == packageName)
			return m_packageInfos[i];
	}

	return DE_NULL;
}